

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

void obx::anon_unknown_3::cCallbackTrampolineAsyncTreeGet
               (obx_err status,obx_id id,char *path,void *leaf_data,size_t leaf_data_size,
               void *leaf_metadata,size_t leaf_metadata_size,void *userData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AsyncTreeGetResult result;
  allocator local_d1;
  _Head_base<0UL,_std::function<void_(const_obx::AsyncTreeGetResult_&)>_*,_false> local_d0;
  string local_c8;
  void *local_a8;
  AsyncTreeGetResult local_a0;
  
  local_a8 = leaf_metadata;
  if (userData != (void *)0x0) {
    paVar1 = &local_c8.field_2;
    local_c8._M_string_length = 0;
    local_d0._M_head_impl = (function<void_(const_obx::AsyncTreeGetResult_&)> *)userData;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    if (status != 0) {
      internal::appendLastErrorText(status,&local_c8);
    }
    std::__cxx11::string::string((string *)&local_a0,path,&local_d1);
    local_a0.errorMessage._M_string_length = local_c8._M_string_length;
    local_a0.errorMessage._M_dataplus._M_p = (pointer)&local_a0.errorMessage.field_2;
    local_a0.leaf_metadata.data = local_a8;
    local_a0.leaf_metadata.size = leaf_metadata_size;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == paVar1) {
      local_a0.errorMessage.field_2._8_8_ = local_c8.field_2._8_8_;
    }
    else {
      local_a0.errorMessage._M_dataplus._M_p = local_c8._M_dataplus._M_p;
    }
    local_a0.errorMessage.field_2._M_allocated_capacity._1_7_ =
         local_c8.field_2._M_allocated_capacity._1_7_;
    local_a0.errorMessage.field_2._M_local_buf[0] = local_c8.field_2._M_local_buf[0];
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    local_a0.status = status;
    local_a0.id = id;
    local_a0.leaf_data.data = leaf_data;
    local_a0.leaf_data.size = leaf_data_size;
    std::function<void_(const_obx::AsyncTreeGetResult_&)>::operator()
              (local_d0._M_head_impl,&local_a0);
    AsyncTreeGetResult::~AsyncTreeGetResult(&local_a0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::
    unique_ptr<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
    ::~unique_ptr((unique_ptr<std::function<void_(const_obx::AsyncTreeGetResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreeGetResult_&)>_>_>
                   *)&local_d0);
    return;
  }
  __assert_fail("userData",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O2/_deps/objectbox-download-src/include/objectbox.hpp"
                ,0xd6c,
                "void obx::(anonymous namespace)::cCallbackTrampolineAsyncTreeGet(obx_err, obx_id, const char *, const void *, size_t, const void *, size_t, void *)"
               );
}

Assistant:

void cCallbackTrampolineAsyncTreeGet(obx_err status, obx_id id, const char* path, const void* leaf_data,
                                     size_t leaf_data_size, const void* leaf_metadata, size_t leaf_metadata_size,
                                     void* userData) {
    assert(userData);
    std::unique_ptr<AsyncTreeGetCallback> callback(static_cast<AsyncTreeGetCallback*>(userData));
    std::string errorMessage;
    if (status != OBX_SUCCESS) internal::appendLastErrorText(status, errorMessage);
    AsyncTreeGetResult result{
        path, status, id, {leaf_data, leaf_data_size}, {leaf_metadata, leaf_metadata_size}, std::move(errorMessage)};
    (*callback)(result);
}